

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  byte *pbVar1;
  nk_style_item_data *img;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  nk_vec2 nVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  nk_window *pnVar14;
  nk_panel *pnVar15;
  long lVar16;
  undefined8 f;
  nk_bool nVar17;
  long lVar18;
  bool bVar19;
  nk_command_buffer *b;
  nk_style_window *pnVar20;
  nk_panel *pnVar21;
  nk_context *in;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  nk_vec2 nVar26;
  undefined1 auVar27 [16];
  nk_vec2 nVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  nk_rect r;
  nk_rect rect;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect b_00;
  nk_rect rect_00;
  nk_rect r_00;
  nk_flags ws;
  nk_text text;
  nk_flags local_ac;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  nk_text local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  nk_command_buffer *local_38;
  
  local_78._8_8_ = local_78._0_8_;
  uVar22 = 0;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (pnVar21 = ctx->current->layout, pnVar21 != (nk_panel *)0x0)) {
    local_a8._0_4_ = panel_type;
    uVar23 = (ulong)pnVar21 & 3;
    if (uVar23 == 0) {
      uVar24 = 0x1c0;
    }
    else {
      memset(pnVar21,0,4 - uVar23);
      uVar24 = uVar23 | 0x1bc;
      pnVar21 = (nk_panel *)((long)pnVar21 + (4 - uVar23));
    }
    uVar23 = (ulong)((uint)uVar24 & 0xfffffffc);
    memset(pnVar21,0,uVar23);
    if ((uVar24 & 3) != 0) {
      memset((void *)((long)&pnVar21->type + uVar23),0,uVar24 & 3);
    }
    pnVar14 = ctx->current;
    uVar22 = pnVar14->flags;
    if ((uVar22 & 0x6000) == 0) {
      local_78._0_8_ = (ctx->style).font;
      pnVar21 = pnVar14->layout;
      in = (nk_context *)0x0;
      if ((uVar22 >> 10 & 1) == 0) {
        in = ctx;
      }
      local_98 = CONCAT44(local_98._4_4_,(ctx->style).window.scrollbar_size.x);
      local_88._0_4_ = (ctx->style).window.scrollbar_size.y;
      nVar26 = nk_panel_get_padding(&ctx->style,local_a8._0_4_);
      fVar38 = nVar26.y;
      if ((uVar22 & 0x1002) == 2) {
        fVar32 = fVar38;
        if ((title != (char *)0x0) && ((uVar22 & 0x58) != 0)) {
          fVar32 = (ctx->style).window.header.padding.y;
          fVar25 = (ctx->style).window.header.label_padding.y;
          fVar32 = fVar25 + fVar25 + fVar32 + fVar32 + *(float *)(local_78._0_8_ + 8);
        }
        uVar2 = (pnVar14->bounds).x;
        uVar8 = (pnVar14->bounds).y;
        iVar13 = (in->input).mouse.buttons[0].down;
        bVar19 = true;
        if (((in != (nk_context *)0x0) &&
            (fVar25 = (in->input).mouse.buttons[0].clicked_pos.x, (float)uVar2 <= fVar25)) &&
           (fVar25 < (float)uVar2 + (pnVar14->bounds).w)) {
          fVar25 = (in->input).mouse.buttons[0].clicked_pos.y;
          bVar19 = iVar13 != 1 || (fVar32 + (float)uVar8 <= fVar25 || fVar25 < (float)uVar8);
        }
        if (((iVar13 != 0) && (!bVar19)) && ((in->input).mouse.buttons[0].clicked == 0)) {
          nVar7 = (in->input).mouse.delta;
          fVar32 = nVar7.x;
          fVar25 = nVar7.y;
          (pnVar14->bounds).x = (float)uVar2 + fVar32;
          (pnVar14->bounds).y = (float)uVar8 + fVar25;
          nVar7 = (in->input).mouse.buttons[0].clicked_pos;
          nVar28.x = nVar7.x + fVar32;
          nVar28.y = nVar7.y + fVar25;
          (in->input).mouse.buttons[0].clicked_pos = nVar28;
          (ctx->style).cursor_active = (ctx->style).cursors[2];
        }
      }
      pnVar21->type = local_a8._0_4_;
      pnVar21->flags = uVar22;
      fVar32 = (pnVar14->bounds).y;
      fVar25 = (pnVar14->bounds).w;
      fVar39 = (pnVar14->bounds).h;
      (pnVar21->bounds).x = (pnVar14->bounds).x;
      (pnVar21->bounds).y = fVar32;
      (pnVar21->bounds).w = fVar25;
      (pnVar21->bounds).h = fVar39;
      fVar32 = nVar26.x;
      (pnVar21->bounds).x = (pnVar21->bounds).x + fVar32;
      (pnVar21->bounds).w = (pnVar21->bounds).w - (fVar32 + fVar32);
      if ((pnVar14->flags & 1) == 0) {
        pnVar21->border = 0.0;
      }
      else {
        lVar18 = 0x1e68;
        if ((int)local_a8._0_4_ < 0x10) {
          if (local_a8._0_4_ == NK_PANEL_GROUP) {
            lVar18 = 0x1e78;
          }
          else if (local_a8._0_4_ == NK_PANEL_POPUP) {
            lVar18 = 0x1e80;
          }
        }
        else if (local_a8._0_4_ == NK_PANEL_CONTEXTUAL) {
          lVar18 = 0x1e70;
        }
        else if (local_a8._0_4_ == NK_PANEL_COMBO) {
          lVar18 = 0x1e6c;
        }
        else if (local_a8._0_4_ == NK_PANEL_MENU) {
          lVar18 = 0x1e74;
        }
        fVar32 = *(float *)((long)&(ctx->input).keyboard.keys[0].down + lVar18);
        pnVar21->border = fVar32;
        uVar3 = (pnVar21->bounds).x;
        uVar9 = (pnVar21->bounds).y;
        uVar4 = (pnVar21->bounds).w;
        uVar10 = (pnVar21->bounds).h;
        auVar34._4_4_ = uVar10;
        auVar34._0_4_ = uVar4;
        auVar34._8_8_ = 0;
        fVar25 = fVar32 + fVar32;
        auVar30._4_4_ = fVar25;
        auVar30._0_4_ = fVar25;
        auVar30._8_4_ = fVar25;
        auVar30._12_4_ = fVar25;
        auVar30 = maxps(auVar30,auVar34);
        (pnVar21->bounds).x = fVar32 + (float)uVar3;
        (pnVar21->bounds).y = fVar32 + (float)uVar9;
        (pnVar21->bounds).w = auVar30._0_4_ - fVar25;
        (pnVar21->bounds).h = auVar30._4_4_ - fVar25;
      }
      fVar32 = (pnVar21->bounds).y;
      pnVar21->at_x = (pnVar21->bounds).x;
      pnVar21->at_y = fVar32;
      pnVar21->max_x = 0.0;
      pnVar21->footer_height = 0.0;
      pnVar21->header_height = 0.0;
      if ((ctx->current != (nk_window *)0x0) &&
         (pnVar15 = ctx->current->layout, pnVar15 != (nk_panel *)0x0)) {
        fVar32 = ((ctx->style).font)->height;
        (pnVar15->row).min_height = fVar32;
        fVar25 = (ctx->style).text.padding.y;
        fVar32 = fVar25 + fVar25 + fVar32;
        (pnVar15->row).min_height = fVar32;
        fVar25 = (ctx->style).window.min_row_height_padding;
        (pnVar15->row).min_height = fVar25 + fVar25 + fVar32;
      }
      (pnVar21->row).index = 0;
      (pnVar21->row).columns = 0;
      (pnVar21->row).ratio = (float *)0x0;
      (pnVar21->row).item_width = 0.0;
      (pnVar21->row).tree_depth = 0;
      (pnVar21->row).height = fVar38;
      pnVar21->has_scrolling = 1;
      uVar22 = pnVar14->flags;
      if ((uVar22 & 0x20) == 0) {
        (pnVar21->bounds).w = (pnVar21->bounds).w - (float)local_98;
      }
      if ((_local_a8 & (undefined1  [16])0xf0) == (undefined1  [16])0x0) {
        fVar38 = 0.0;
        if ((uVar22 & 0x24) != 0x20) {
          fVar38 = (float)local_88._0_4_;
        }
        pnVar21->footer_height = fVar38;
        (pnVar21->bounds).h = (pnVar21->bounds).h - fVar38;
      }
      b = &pnVar14->buffer;
      if (((title != (char *)0x0) && ((pnVar14->flags & 0x58) != 0)) &&
         ((pnVar14->flags & 0x2000) == 0)) {
        local_a8._0_4_ = (pnVar14->bounds).x;
        local_a8._4_4_ = (pnVar14->bounds).y;
        fVar38 = (pnVar14->bounds).w;
        fVar32 = (ctx->style).window.header.padding.y;
        fVar25 = (ctx->style).window.header.label_padding.y;
        fVar32 = fVar25 + fVar25 + fVar32 + fVar32 + *(float *)(local_78._0_8_ + 8);
        pnVar21->header_height = fVar32;
        (pnVar21->bounds).y = (pnVar21->bounds).y + fVar32;
        (pnVar21->bounds).h = (pnVar21->bounds).h - fVar32;
        pnVar21->at_y = pnVar21->at_y + fVar32;
        if (ctx->active == pnVar14) {
          pnVar20 = (nk_style_window *)&(ctx->style).window.header.active;
          local_68.text = (ctx->style).window.header.label_active;
        }
        else {
          fVar25 = (ctx->input).mouse.pos.x;
          if ((((fVar25 < (float)local_a8._0_4_) || ((float)local_a8._0_4_ + fVar38 <= fVar25)) ||
              (fVar25 = (ctx->input).mouse.pos.y, fVar25 < (float)local_a8._4_4_)) ||
             ((float)local_a8._4_4_ + fVar32 <= fVar25)) {
            pnVar20 = &(ctx->style).window;
            local_68.text = (ctx->style).window.header.label_normal;
          }
          else {
            pnVar20 = (nk_style_window *)&(ctx->style).window.header.hover;
            local_68.text = (ctx->style).window.header.label_hover;
          }
        }
        local_88._4_4_ = local_a8._4_4_;
        local_88._0_4_ = local_a8._4_4_;
        fStack_80 = (float)local_a8._4_4_;
        fStack_7c = (float)local_a8._4_4_;
        fVar32 = fVar32 + 1.0;
        local_48 = ZEXT416((uint)fVar32);
        local_58 = ZEXT416((uint)fVar38);
        r._8_8_ = CONCAT44(fVar32,fVar38);
        _uStack_a0 = 0;
        uStack_90 = 0;
        local_98 = r._8_8_;
        if ((pnVar20->header).normal.type == NK_STYLE_ITEM_IMAGE) {
          local_68.background.r = '\0';
          local_68.background.g = '\0';
          local_68.background.b = '\0';
          local_68.background.a = '\0';
          r.x = (float)local_a8._0_4_;
          r.y = (float)local_a8._4_4_;
          nk_draw_image(b,r,&(pnVar20->header).normal.data.image,(nk_color)0xffffffff);
        }
        else {
          local_68.background = (pnVar20->header).normal.data.color;
          rect.w = fVar38;
          rect.h = fVar32;
          rect.x = (float)local_a8._0_4_;
          rect.y = (float)local_a8._4_4_;
          nk_fill_rect(b,rect,0.0,local_68.background);
        }
        fVar38 = (ctx->style).window.header.padding.y;
        auVar35._0_4_ = (float)local_88._0_4_ + fVar38;
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        fVar38 = (float)local_48._0_4_ - (fVar38 + fVar38);
        auVar30 = CONCAT412(fVar38,CONCAT48(fVar38,CONCAT44(fVar38,fVar38)));
        if ((pnVar14->flags & 8) != 0) {
          local_ac = 0;
          local_48._0_4_ = fVar38;
          register0x000012c4 = auVar35._4_12_;
          if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
            fVar32 = (ctx->style).window.header.padding.x;
            fVar25 = ((float)local_a8._0_4_ + (float)local_58._0_4_) - (fVar38 + fVar32);
            local_98 = CONCAT44(local_98._4_4_,
                                (float)local_58._0_4_ -
                                ((ctx->style).window.header.spacing.x + fVar38 + fVar32));
          }
          else {
            fVar32 = (ctx->style).window.header.padding.x;
            fVar25 = (float)local_a8._0_4_ + fVar32;
            local_a8._0_4_ =
                 (float)local_a8._0_4_ + (ctx->style).window.header.spacing.x + fVar38 + fVar32;
          }
          local_88._0_4_ = fVar25;
          bounds.y = auVar35._0_4_;
          bounds.x = fVar25;
          bounds.w = fVar38;
          bounds.h = fVar38;
          local_58 = auVar30;
          nVar17 = nk_do_button_symbol(&local_ac,b,bounds,(ctx->style).window.header.close_symbol,
                                       NK_BUTTON_DEFAULT,&(ctx->style).window.header.close_button,
                                       &in->input,(ctx->style).font);
          if ((nVar17 != 0) && ((pnVar14->flags & 0x1000) == 0)) {
            pnVar21->flags = pnVar21->flags & 0xffff5fff | 0x2000;
          }
          auVar30 = local_58;
          auVar35 = _local_88;
          fVar38 = (float)local_48._0_4_;
        }
        if ((pnVar14->flags & 0x10) != 0) {
          local_ac = 0;
          auVar36._4_12_ = auVar35._4_12_;
          if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
            fVar32 = ((float)local_98 + (float)local_a8._0_4_) - fVar38;
            if ((pnVar14->flags & 8) == 0) {
              fVar25 = (ctx->style).window.header.padding.x;
              fVar32 = fVar32 - fVar25;
              local_98._0_4_ = (float)local_98 - fVar25;
            }
            auVar36._0_4_ = fVar32;
            local_98 = CONCAT44(local_98._4_4_,
                                (float)local_98 - (fVar38 + (ctx->style).window.header.spacing.x));
          }
          else {
            auVar36._4_4_ = auVar35._4_4_;
            auVar36._0_4_ = local_a8._0_4_;
            auVar36._8_4_ = uStack_a0;
            auVar36._12_4_ = uStack_9c;
            local_a8._0_4_ =
                 (float)local_a8._0_4_ +
                 fVar38 + (ctx->style).window.header.spacing.x +
                 (ctx->style).window.header.padding.x;
          }
          bounds_00._0_8_ = auVar36._0_8_;
          bounds_00._8_8_ = auVar30._0_8_;
          nVar17 = nk_do_button_symbol(&local_ac,b,bounds_00,
                                       (&(ctx->style).window.header.minimize_symbol)
                                       [(ushort)((ushort)pnVar21->flags >> 0xf)],NK_BUTTON_DEFAULT,
                                       &(ctx->style).window.header.minimize_button,&in->input,
                                       (ctx->style).font);
          if ((nVar17 != 0) && ((pnVar14->flags & 0x1000) == 0)) {
            pbVar1 = (byte *)((long)&pnVar21->flags + 1);
            *pbVar1 = *pbVar1 ^ 0x80;
          }
        }
        lVar18 = 0;
        if ((title != (char *)0x0) && (*title != '\0')) {
          lVar18 = 0;
          do {
            lVar16 = lVar18 + 1;
            lVar18 = lVar18 + 1;
          } while (title[lVar16] != '\0');
        }
        f = local_78._0_8_;
        local_38 = b;
        fVar32 = (*(code *)*(nk_handle *)(local_78._0_8_ + 0x10))
                           (*(nk_handle *)local_78._0_8_,
                            (float)((nk_handle *)(local_78._0_8_ + 8))->id,title,(int)lVar18);
        b = local_38;
        local_68.padding.x = 0.0;
        local_68.padding.y = 0.0;
        nVar26 = (ctx->style).window.header.label_padding;
        fVar39 = (float)local_a8._0_4_ + (ctx->style).window.header.padding.x + nVar26.x;
        fVar25 = nVar26.y;
        fVar38 = (ctx->style).window.header.spacing.x;
        fVar32 = fVar38 + fVar38 + fVar32;
        fVar38 = ((float)local_98 + (float)local_a8._0_4_) - fVar39;
        if (fVar38 <= fVar32) {
          fVar32 = fVar38;
        }
        fVar38 = 0.0;
        if (0.0 <= fVar32) {
          fVar38 = fVar32;
        }
        b_00.h = fVar25 + fVar25 + *(float *)(f + 8);
        b_00.w = fVar38;
        b_00.y = (float)local_a8._4_4_ + fVar25;
        b_00.x = fVar39;
        nk_widget_text(local_38,b_00,title,(int)lVar18,&local_68,0x11,(nk_user_font *)f);
      }
      if ((pnVar21->flags & 0x8800) == 0) {
        fVar25 = (pnVar14->bounds).y + pnVar21->header_height;
        fVar38 = (pnVar14->bounds).x;
        fVar32 = (pnVar14->bounds).w;
        fVar39 = (pnVar14->bounds).h - pnVar21->header_height;
        img = &(ctx->style).window.fixed_background.data;
        if ((ctx->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
          nk_draw_image(b,(nk_rect)CONCAT88(CONCAT44(fVar39,fVar32),CONCAT44(fVar25,fVar38)),
                        &img->image,(nk_color)0xffffffff);
        }
        else {
          rect_00.w = fVar32;
          rect_00.h = fVar39;
          rect_00.x = fVar38;
          rect_00.y = fVar25;
          nk_fill_rect(b,rect_00,0.0,img->color);
        }
      }
      fVar38 = (pnVar21->bounds).y;
      fVar32 = (pnVar21->bounds).w;
      fVar25 = (pnVar21->bounds).h;
      (pnVar21->clip).x = (pnVar21->bounds).x;
      (pnVar21->clip).y = fVar38;
      (pnVar21->clip).w = fVar32;
      (pnVar21->clip).h = fVar25;
      uVar23._0_4_ = (pnVar21->clip).x;
      uVar23._4_4_ = (pnVar21->clip).y;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar23;
      uVar5 = (pnVar21->clip).w;
      uVar11 = (pnVar21->clip).h;
      auVar33._0_4_ = (float)uVar5 + (float)(undefined4)uVar23;
      auVar33._4_4_ = (float)uVar11 + (float)uVar23._4_4_;
      auVar33._8_8_ = 0;
      uVar24._0_4_ = (pnVar14->buffer).clip.x;
      uVar24._4_4_ = (pnVar14->buffer).clip.y;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar24;
      uVar6 = (pnVar14->buffer).clip.w;
      uVar12 = (pnVar14->buffer).clip.h;
      _local_a8 = maxps(auVar27,auVar37);
      auVar29._0_4_ = (float)uVar6 + (float)(undefined4)uVar24;
      auVar29._4_4_ = (float)uVar12 + (float)uVar24._4_4_;
      auVar29._8_8_ = 0;
      auVar30 = minps(auVar29,auVar33);
      auVar31._0_4_ = auVar30._0_4_ - local_a8._0_4_;
      auVar31._4_4_ = auVar30._4_4_ - local_a8._4_4_;
      auVar31._8_4_ = auVar30._8_4_ - local_a8._8_4_;
      auVar31._12_4_ = auVar30._12_4_ - local_a8._12_4_;
      local_78 = maxps(auVar31,ZEXT816(0));
      r_00._0_8_ = local_a8;
      r_00._8_8_ = local_78._0_8_;
      nk_push_scissor(b,r_00);
      (pnVar21->clip).x = (float)local_a8._0_4_;
      (pnVar21->clip).y = (float)local_a8._4_4_;
      (pnVar21->clip).w = (float)local_78._0_4_;
      (pnVar21->clip).h = (float)local_78._4_4_;
      uVar22 = (uint)(-1 < (short)pnVar21->flags);
      if ((pnVar21->flags >> 0xd & 1) != 0) {
        uVar22 = 0;
      }
    }
    else {
      pnVar21 = pnVar14->layout;
      uVar23 = (ulong)pnVar21 & 3;
      if (uVar23 == 0) {
        uVar24 = 0x1c0;
      }
      else {
        memset(pnVar21,0,4 - uVar23);
        uVar24 = uVar23 | 0x1bc;
        pnVar21 = (nk_panel *)((long)pnVar21 + (4 - uVar23));
      }
      uVar23 = (ulong)((uint)uVar24 & 0xfffffffc);
      uVar22 = 0;
      memset(pnVar21,0,uVar23);
      if ((uVar24 & 3) != 0) {
        memset((void *)((long)&pnVar21->type + uVar23),0,uVar24 & 3);
      }
      ctx->current->layout->type = local_a8._0_4_;
    }
  }
  return uVar22;
}

Assistant:

NK_LIB nk_bool
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
struct nk_input *in;
struct nk_window *win;
struct nk_panel *layout;
struct nk_command_buffer *out;
const struct nk_style *style;
const struct nk_user_font *font;

struct nk_vec2 scrollbar_size;
struct nk_vec2 panel_padding;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return 0;
nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
nk_zero(ctx->current->layout, sizeof(struct nk_panel));
ctx->current->layout->type = panel_type;
return 0;
}
/* pull state into local stack */
style = &ctx->style;
font = style->font;
win = ctx->current;
layout = win->layout;
out = &win->buffer;
in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
win->buffer.userdata = ctx->userdata;
#endif
/* pull style configuration into local stack */
scrollbar_size = style->window.scrollbar_size;
panel_padding = nk_panel_get_padding(style, panel_type);

/* window movement */
if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
int left_mouse_down;
int left_mouse_clicked;
int left_mouse_click_in_cursor;

/* calculate draggable window space */
struct nk_rect header;
header.x = win->bounds.x;
header.y = win->bounds.y;
header.w = win->bounds.w;
if (nk_panel_has_header(win->flags, title)) {
header.h = font->height + 2.0f * style->window.header.padding.y;
header.h += 2.0f * style->window.header.label_padding.y;
} else header.h = panel_padding.y;

/* window movement by dragging */
left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
NK_BUTTON_LEFT, header, nk_true);
if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
win->bounds.x = win->bounds.x + in->mouse.delta.x;
win->bounds.y = win->bounds.y + in->mouse.delta.y;
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
}
}

/* setup panel */
layout->type = panel_type;
layout->flags = win->flags;
layout->bounds = win->bounds;
layout->bounds.x += panel_padding.x;
layout->bounds.w -= 2*panel_padding.x;
if (win->flags & NK_WINDOW_BORDER) {
layout->border = nk_panel_get_border(style, win->flags, panel_type);
layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
} else layout->border = 0;
layout->at_y = layout->bounds.y;
layout->at_x = layout->bounds.x;
layout->max_x = 0;
layout->header_height = 0;
layout->footer_height = 0;
nk_layout_reset_min_row_height(ctx);
layout->row.index = 0;
layout->row.columns = 0;
layout->row.ratio = 0;
layout->row.item_width = 0;
layout->row.tree_depth = 0;
layout->row.height = panel_padding.y;
layout->has_scrolling = nk_true;
if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
layout->bounds.w -= scrollbar_size.x;
if (!nk_panel_is_nonblock(panel_type)) {
layout->footer_height = 0;
if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
layout->footer_height = scrollbar_size.y;
layout->bounds.h -= layout->footer_height;
}

/* panel header */
if (nk_panel_has_header(win->flags, title))
{
struct nk_text text;
struct nk_rect header;
const struct nk_style_item *background = 0;

/* calculate header bounds */
header.x = win->bounds.x;
header.y = win->bounds.y;
header.w = win->bounds.w;
header.h = font->height + 2.0f * style->window.header.padding.y;
header.h += (2.0f * style->window.header.label_padding.y);

/* shrink panel by header */
layout->header_height = header.h;
layout->bounds.y += header.h;
layout->bounds.h -= header.h;
layout->at_y += header.h;

/* select correct header background and text color */
if (ctx->active == win) {
background = &style->window.header.active;
text.text = style->window.header.label_active;
} else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
background = &style->window.header.hover;
text.text = style->window.header.label_hover;
} else {
background = &style->window.header.normal;
text.text = style->window.header.label_normal;
}

/* draw header background */
header.h += 1.0f;
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(out, header, 0, background->data.color);
}

/* window close button */
{struct nk_rect button;
button.y = header.y + style->window.header.padding.y;
button.h = header.h - 2 * style->window.header.padding.y;
button.w = button.h;
if (win->flags & NK_WINDOW_CLOSABLE) {
nk_flags ws = 0;
if (style->window.header.align == NK_HEADER_RIGHT) {
button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
} else {
button.x = header.x + style->window.header.padding.x;
header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
}

if (nk_do_button_symbol(&ws, &win->buffer, button,
style->window.header.close_symbol, NK_BUTTON_DEFAULT,
&style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
{
layout->flags |= NK_WINDOW_HIDDEN;
layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
}
}

/* window minimize button */
if (win->flags & NK_WINDOW_MINIMIZABLE) {
nk_flags ws = 0;
if (style->window.header.align == NK_HEADER_RIGHT) {
button.x = (header.w + header.x) - button.w;
if (!(win->flags & NK_WINDOW_CLOSABLE)) {
button.x -= style->window.header.padding.x;
header.w -= style->window.header.padding.x;
}
header.w -= button.w + style->window.header.spacing.x;
} else {
button.x = header.x;
header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
}
if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
style->window.header.maximize_symbol: style->window.header.minimize_symbol,
NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
layout->flags | NK_WINDOW_MINIMIZED;
}}

{/* window header title */
int text_len = nk_strlen(title);
struct nk_rect label = {0,0,0,0};
float t = font->width(font->userdata, font->height, title, text_len);
text.padding = nk_vec2(0,0);

label.x = header.x + style->window.header.padding.x;
label.x += style->window.header.label_padding.x;
label.y = header.y + style->window.header.label_padding.y;
label.h = font->height + 2 * style->window.header.label_padding.y;
label.w = t + 2 * style->window.header.spacing.x;
label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
}

/* draw window background */
if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
struct nk_rect body;
body.x = win->bounds.x;
body.w = win->bounds.w;
body.y = (win->bounds.y + layout->header_height);
body.h = (win->bounds.h - layout->header_height);
if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
}

/* set clipping rectangle */
{struct nk_rect clip;
layout->clip = layout->bounds;
nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
nk_push_scissor(out, clip);
layout->clip = clip;}
return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}